

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<char_const(&)[57],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3]>
                   (string *__return_storage_ptr__,char (*a) [57],
                   basic_string_view<char,_std::char_traits<char>_> *b,char (*args) [3])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_70;
  size_t local_58;
  char *pcStack_50;
  undefined8 local_48;
  size_t local_40;
  char (*local_38) [3];
  undefined8 local_30;
  
  local_70.first._M_len = strlen(*a);
  local_70.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58 = b->_M_len;
  pcStack_50 = b->_M_str;
  local_48 = 0;
  local_70.first._M_str = *a;
  local_40 = strlen(*args);
  local_30 = 0;
  views._M_len = 3;
  views._M_array = &local_70;
  local_38 = args;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}